

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *this,
          EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
          *_other)

{
  long nbCols;
  
  nbCols = *(long *)(_other + 8);
  if (nbCols == 0) {
    nbCols = 0;
  }
  else if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(nbCols),0) < 1) {
    internal::throw_std_bad_alloc();
    nbCols = *(long *)(_other + 8);
  }
  PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,1,nbCols);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }